

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UT_OK.cpp
# Opt level: O0

void __thiscall copy_no_default5::test_method(copy_no_default5 *this)

{
  anon_class_16_2_947320ab checks;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  undefined4 local_18c;
  size_type local_188;
  basic_cstring<const_char> local_180;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_170;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  string_literal<char,(char)101> local_121;
  proxy<const_std::vector<int,_std::allocator<int>_>_&,_char,__e_> local_120;
  string_literal<char,(char)100> local_111;
  double local_110;
  proxy<double,_char,__d_> local_108;
  string_literal<char,(char)99> local_f9;
  proxy<const_char_(&)[4],_char,__c_> local_f8;
  string_literal<char,(char)98> local_e9;
  proxy<std::vector<int,_std::allocator<int>_>_&,_char,__b_> local_e8;
  string_literal<char,(char)97> local_dd;
  int local_dc;
  proxy<int,_char,__a_> local_d8;
  vector<int,_std::allocator<int>_> *local_d0;
  vector<int,_std::allocator<int>_> *local_c8;
  allocator<int> local_b9;
  int local_b8 [8];
  iterator local_98;
  size_type local_90;
  undefined1 local_88 [8];
  vector<int,_std::allocator<int>_> x;
  allocator<int> local_59;
  int local_58 [8];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> v;
  copy_no_default5 *this_local;
  
  local_58[0] = 1;
  local_58[1] = 2;
  local_58[2] = 3;
  local_58[3] = 4;
  local_58[4] = 5;
  local_38 = local_58;
  local_30 = 5;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)this;
  std::allocator<int>::allocator(&local_59);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l_00,&local_59);
  std::allocator<int>::~allocator(&local_59);
  local_b8[0] = 0xb;
  local_b8[1] = 0xc;
  local_b8[2] = 0xd;
  local_b8[3] = 0xe;
  local_b8[4] = 0xf;
  local_98 = local_b8;
  local_90 = 5;
  std::allocator<int>::allocator(&local_b9);
  __l._M_len = local_90;
  __l._M_array = local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_88,__l,&local_b9);
  std::allocator<int>::~allocator(&local_b9);
  local_d0 = (vector<int,_std::allocator<int>_> *)local_28;
  local_c8 = (vector<int,_std::allocator<int>_> *)local_88;
  local_dc = 0x2a;
  na::literals::operator___na<char,__a_>();
  local_d8 = na::literals::string_literal<char,(char)97>::operator=(&local_dd,&local_dc);
  na::literals::operator___na<char,__b_>();
  local_e8 = na::literals::string_literal<char,(char)98>::operator=
                       (&local_e9,(vector<int,_std::allocator<int>_> *)local_28);
  na::literals::operator___na<char,__c_>();
  local_f8 = na::literals::string_literal<char,(char)99>::operator=(&local_f9,(char (*) [4])"foo");
  local_110 = 12.5;
  na::literals::operator___na<char,__d_>();
  local_108 = na::literals::string_literal<char,(char)100>::operator=(&local_111,&local_110);
  na::literals::operator___na<char,__e_>();
  local_120 = na::literals::string_literal<char,(char)101>::operator=
                        (&local_121,(vector<int,_std::allocator<int>_> *)local_88);
  checks.x = local_c8;
  checks.v = local_d0;
  f_copy_no_default5<copy_no_default5::test_method()::__0,na::literals::proxy<int,char,(char)97>,na::literals::proxy<std::vector<int,std::allocator<int>>&,char,(char)98>,na::literals::proxy<char_const(&)[4],char,(char)99>,na::literals::proxy<double,char,(char)100>,na::literals::proxy<std::vector<int,std::allocator<int>>const&,char,(char)101>>
            (checks,&local_d8,&local_e8,&local_f8,&local_108,&local_120);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_148);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_138,0x95,&local_148);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_170,prev,(char (*) [1])0x1312fa);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LucHermitte[P]NamedParameter/tests/UT_OK.cpp"
               ,0x65);
    local_188 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_28);
    local_18c = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_170,&local_180,0x95,1,2,&local_188,"v.size()",&local_18c,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_170);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_88);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(copy_no_default5)
{
    auto       v = std::vector<int>{ 1, 2, 3, 4, 5};
    auto const x = std::vector<int>{ 11, 12, 13, 14, 15};
    f_copy_no_default5(
            [&](auto&& a, auto&& b, auto&& c, auto&& d, auto&& e) {
            BOOST_CHECK_EQUAL(a, 42);
            BOOST_CHECK_EQUAL_COLLECTIONS(
                    std::begin(b), std::end(b),
                    std::begin(v), std::end(v));
            BOOST_CHECK_EQUAL(c, "foo");
            BOOST_CHECK_EQUAL(d, 12.5);
            BOOST_CHECK_EQUAL_COLLECTIONS(
                    std::begin(e), std::end(e),
                    std::begin(x), std::end(x));
            },
            "a"_na=42,
            "b"_na=v,
            "c"_na="foo",
            "d"_na=12.5,
            "e"_na=x
            );
    BOOST_CHECK_EQUAL(v.size(), 5); // check v was copied
}